

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sourcesdialog.cpp
# Opt level: O2

void __thiscall FSSSourcesDialog::~FSSSourcesDialog(FSSSourcesDialog *this)

{
  ~FSSSourcesDialog(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

void
FSSSourcesDialog::add_source(Data::PSource source) {
  QHBoxLayout *line_layout = new QHBoxLayout();
  layout->addRow(source->get_name().c_str(), line_layout);

  QLabel *label = new QLabel(this);
  label->setPixmap(QPixmap(source->is_loaded() ?
                           ":/icons/Actions-dialog-ok-apply-icon.png" :
                           ":/icons/Actions-edit-delete-icon.png"));
  line_layout->addWidget(label);

  QPathEdit *path_edit = new QPathEdit(this);
  FSSDataModel::DataSourceType type = FSSDataModel::getType(source);
  path_edit->setPathMode((type == FSSDataModel::DataSourceTypeDos) ?
                         QPathEdit::ExistingFile :
                         QPathEdit::ExistingFolder);
  path_edit->setPath(source->get_path().c_str());
  line_layout->addWidget(path_edit);
}